

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

void ma_free(void *p,ma_allocation_callbacks *pAllocationCallbacks)

{
  if (p != (void *)0x0) {
    if (pAllocationCallbacks == (ma_allocation_callbacks *)0x0) {
      free(p);
      return;
    }
    if (pAllocationCallbacks->onFree != (_func_void_void_ptr_void_ptr *)0x0) {
      (*pAllocationCallbacks->onFree)(p,pAllocationCallbacks->pUserData);
      return;
    }
  }
  return;
}

Assistant:

MA_API void ma_free(void* p, const ma_allocation_callbacks* pAllocationCallbacks)
{
    if (p == NULL) {
        return;
    }

    if (pAllocationCallbacks != NULL) {
        if (pAllocationCallbacks->onFree != NULL) {
            pAllocationCallbacks->onFree(p, pAllocationCallbacks->pUserData);
        } else {
            return; /* Do no fall back to the default implementation. */
        }
    } else {
        ma__free_default(p, NULL);
    }
}